

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# analyzer.cpp
# Opt level: O3

void __thiscall
SQCompilation::CheckerVisitor::computeNameRef
          (CheckerVisitor *this,Expr *e,SQChar *b,int32_t *ptr,int32_t size)

{
  TreeOp TVar1;
  int iVar2;
  
  TVar1 = (e->super_Node)._op;
  if ((int)TVar1 < 0x3b) {
    if (TVar1 == TO_ID) {
      iVar2 = snprintf(b + *ptr,(long)size - (long)*ptr,"%s",
                       e[1].super_Node.super_ArenaObj._vptr_ArenaObj);
      *ptr = *ptr + iVar2;
    }
    else if (TVar1 == TO_BASE) {
      snprintf(b + *ptr,(long)size - (long)*ptr,"%s",&base_str);
      *ptr = *ptr + 5;
    }
  }
  else if (TVar1 == TO_ROOT_TABLE_ACCESS) {
    snprintf(b + *ptr,(long)size - (long)*ptr,"%s",&double_colon_str);
    *ptr = *ptr + 3;
  }
  else if (TVar1 == TO_GETFIELD) {
    computeNameRef(this,(GetFieldExpr *)e,b,ptr,size);
    return;
  }
  return;
}

Assistant:

void CheckerVisitor::computeNameRef(const Expr *e, SQChar *b, int32_t &ptr, int32_t size) {
  switch (e->op())
  {
  case TO_GETFIELD: return computeNameRef(e->asGetField(), b, ptr, size);
  //case TO_GETSLOT: return computeNameRef(lhs->asGetSlot());
  case TO_ID: {
    int32_t l = snprintf(&b[ptr], size - ptr, "%s", e->asId()->id());
    ptr += l;
    break;
  }
  case TO_ROOT_TABLE_ACCESS:
    snprintf(&b[ptr], size - ptr, "%s", double_colon_str);
    ptr += sizeof double_colon_str;
    break;
  case TO_BASE:
    snprintf(&b[ptr], size - ptr, "%s", base_str);
    ptr += sizeof base_str;
    break;
  default:
    assert(0);
  }
}